

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_posix_file_impl.h
# Opt level: O0

int64_t default_query_size_func(exr_const_context_t ctxt,void *userdata)

{
  int iVar1;
  int *in_RSI;
  int rv;
  int64_t sz;
  _internal_exr_filehandle *fh;
  stat sbuf;
  int64_t local_b0;
  stat local_a0;
  
  local_b0 = -1;
  if ((-1 < *in_RSI) && (iVar1 = fstat(*in_RSI,&local_a0), iVar1 == 0)) {
    local_b0 = local_a0.st_size;
  }
  return local_b0;
}

Assistant:

static int64_t
default_query_size_func (exr_const_context_t ctxt, void* userdata)
{
    struct stat                      sbuf;
    struct _internal_exr_filehandle* fh = userdata;
    int64_t                          sz = -1;

    if (fh->fd >= 0)
    {
        int rv = fstat (fh->fd, &sbuf);
        if (rv == 0) sz = (int64_t) sbuf.st_size;
    }

    (void) ctxt;
    return sz;
}